

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xpointer(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xpointer : 13 of 21 functions ...\n");
  }
  iVar1 = test_xmlXPtrBuildNodeList();
  iVar2 = test_xmlXPtrEval();
  iVar3 = test_xmlXPtrEvalRangePredicate();
  iVar4 = test_xmlXPtrNewCollapsedRange();
  iVar5 = test_xmlXPtrNewContext();
  iVar6 = test_xmlXPtrNewLocationSetNodeSet();
  iVar7 = test_xmlXPtrNewLocationSetNodes();
  iVar8 = test_xmlXPtrNewRange();
  iVar9 = test_xmlXPtrNewRangeNodeObject();
  iVar10 = test_xmlXPtrNewRangeNodePoint();
  iVar11 = test_xmlXPtrNewRangeNodes();
  iVar12 = test_xmlXPtrNewRangePointNode();
  iVar13 = test_xmlXPtrNewRangePoints();
  iVar14 = test_xmlXPtrRangeToFunction();
  uVar15 = iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar15 != 0) {
    printf("Module xpointer: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_xpointer(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpointer : 13 of 21 functions ...\n");
    test_ret += test_xmlXPtrBuildNodeList();
    test_ret += test_xmlXPtrEval();
    test_ret += test_xmlXPtrEvalRangePredicate();
    test_ret += test_xmlXPtrNewCollapsedRange();
    test_ret += test_xmlXPtrNewContext();
    test_ret += test_xmlXPtrNewLocationSetNodeSet();
    test_ret += test_xmlXPtrNewLocationSetNodes();
    test_ret += test_xmlXPtrNewRange();
    test_ret += test_xmlXPtrNewRangeNodeObject();
    test_ret += test_xmlXPtrNewRangeNodePoint();
    test_ret += test_xmlXPtrNewRangeNodes();
    test_ret += test_xmlXPtrNewRangePointNode();
    test_ret += test_xmlXPtrNewRangePoints();
    test_ret += test_xmlXPtrRangeToFunction();

    if (test_ret != 0)
	printf("Module xpointer: %d errors\n", test_ret);
    return(test_ret);
}